

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(ostream *os,char *s)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char *c;
  char local_29;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  do {
    cVar1 = *s;
    if (cVar1 == '\"') {
      lVar2 = 2;
      pcVar3 = "\\\"";
    }
    else if (cVar1 == '\\') {
      lVar2 = 2;
      pcVar3 = "\\\\";
    }
    else {
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        return;
      }
      lVar2 = 1;
      pcVar3 = &local_29;
      local_29 = cVar1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
    s = s + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(std::ostream& os,
                                                       const char* s)
{
  // Write the given string to the stream with escaping to get it back
  // into CMake through the lexical scanner.
  os << "\"";
  for (const char* c = s; *c; ++c) {
    if (*c == '\\') {
      os << "\\\\";
    } else if (*c == '"') {
      os << "\\\"";
    } else {
      os << *c;
    }
  }
  os << "\"";
}